

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O0

bool __thiscall TextProviderString::is_valid(TextProviderString *this)

{
  bool bVar1;
  __optional_ne_t<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char>_>_>
  local_19;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  TextProviderString *local_10;
  TextProviderString *this_local;
  
  local_10 = this;
  bVar1 = TextProvider::is_valid(&this->super_TextProvider);
  local_19 = false;
  if (bVar1) {
    local_18._M_current = (char *)std::__cxx11::string::end();
    local_19 = std::operator!=(&this->m_iterator,&local_18);
  }
  return local_19;
}

Assistant:

bool TextProviderString::is_valid()
{
	return TextProvider::is_valid() && m_iterator != m_text.end();
}